

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_compress.c
# Opt level: O2

TIFFCodec * TIFFGetConfiguredCODECs(void)

{
  int iVar1;
  void *pvVar2;
  void *p;
  int iVar3;
  long lVar4;
  codec_t **ppcVar5;
  TIFFCodec *pTVar6;
  
  ppcVar5 = &registeredCODECS;
  iVar3 = 1;
  p = (void *)0x0;
  lVar4 = 0;
  while (ppcVar5 = &((codec_t *)ppcVar5)->next->next, (codec_t *)ppcVar5 != (codec_t *)0x0) {
    pvVar2 = _TIFFreallocExt((TIFF *)0x0,p,lVar4 + 0x18);
    if (pvVar2 == (void *)0x0) goto LAB_00248a2c;
    _TIFFmemcpy((void *)(lVar4 + (long)pvVar2),((codec_t *)ppcVar5)->info,0x18);
    iVar3 = iVar3 + 1;
    p = pvVar2;
    lVar4 = lVar4 + 0x18;
  }
  pTVar6 = _TIFFBuiltinCODECS;
  while( true ) {
    lVar4 = (long)iVar3;
    if (pTVar6->name == (char *)0x0) break;
    iVar1 = TIFFIsCODECConfigured(pTVar6->scheme);
    pvVar2 = p;
    if (iVar1 != 0) {
      pvVar2 = _TIFFreallocExt((TIFF *)0x0,p,lVar4 * 0x18);
      if (pvVar2 == (void *)0x0) goto LAB_00248a2c;
      _TIFFmemcpy((void *)((long)pvVar2 + lVar4 * 0x18 + -0x18),pTVar6,0x18);
      iVar3 = iVar3 + 1;
    }
    pTVar6 = pTVar6 + 1;
    p = pvVar2;
  }
  pTVar6 = (TIFFCodec *)_TIFFreallocExt((TIFF *)0x0,p,lVar4 * 0x18);
  if (pTVar6 == (TIFFCodec *)0x0) {
LAB_00248a2c:
    pTVar6 = (TIFFCodec *)0x0;
    _TIFFfreeExt((TIFF *)0x0,p);
  }
  else {
    _TIFFmemset(pTVar6 + lVar4 + -1,0,0x18);
  }
  return pTVar6;
}

Assistant:

TIFFCodec *TIFFGetConfiguredCODECs()
{
    int i = 1;
    codec_t *cd;
    const TIFFCodec *c;
    TIFFCodec *codecs = NULL;
    TIFFCodec *new_codecs;

    for (cd = registeredCODECS; cd; cd = cd->next)
    {
        new_codecs =
            (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
        if (!new_codecs)
        {
            _TIFFfreeExt(NULL, codecs);
            return NULL;
        }
        codecs = new_codecs;
        _TIFFmemcpy(codecs + i - 1, cd->info, sizeof(TIFFCodec));
        i++;
    }
    for (c = _TIFFBuiltinCODECS; c->name; c++)
    {
        if (TIFFIsCODECConfigured(c->scheme))
        {
            new_codecs = (TIFFCodec *)_TIFFreallocExt(NULL, codecs,
                                                      i * sizeof(TIFFCodec));
            if (!new_codecs)
            {
                _TIFFfreeExt(NULL, codecs);
                return NULL;
            }
            codecs = new_codecs;
            _TIFFmemcpy(codecs + i - 1, (const void *)c, sizeof(TIFFCodec));
            i++;
        }
    }

    new_codecs =
        (TIFFCodec *)_TIFFreallocExt(NULL, codecs, i * sizeof(TIFFCodec));
    if (!new_codecs)
    {
        _TIFFfreeExt(NULL, codecs);
        return NULL;
    }
    codecs = new_codecs;
    _TIFFmemset(codecs + i - 1, 0, sizeof(TIFFCodec));

    return codecs;
}